

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void set_sgb_attr_block(Emulator *e,int x0,int y0,int x1,int y1,u8 pal)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int x;
  int iVar4;
  uint uVar5;
  
  iVar3 = y0 * 0x14;
  for (; iVar4 = x0, iVar2 = x0 * 2, y0 <= y1; y0 = y0 + 1) {
    for (; iVar4 <= x1; iVar4 = iVar4 + 1) {
      uVar5 = (uint)(iVar3 + iVar4) >> 2;
      bVar1 = (byte)iVar2 & 6;
      (e->state).sgb.attr_map[uVar5] =
           pal << (bVar1 ^ 6) | (e->state).sgb.attr_map[uVar5] & (byte)(-0xc1 >> bVar1);
      iVar2 = iVar2 + 2;
    }
    iVar3 = iVar3 + 0x14;
  }
  return;
}

Assistant:

static void set_sgb_attr_block(Emulator* e, int x0, int y0, int x1, int y1,
                               u8 pal) {
  for (int y = y0; y <= y1; ++y) {
    for (int x = x0; x <= x1; ++x) {
      int index = y * 20 + x;
      u8 *byte = &SGB.attr_map[index >> 2];
      u8 mask = ~(0xc0 >> (2 * (x & 3)));
      *byte = (*byte & mask) | (pal << (2 * (3 - (x & 3))));
    }
  }
}